

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O1

bool illegalIpxSolvedStatus(Info *ipx_info,HighsOptions *options)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  iVar1 = (ipx_info->super_ipx_info).status_ipm;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"solved  status_ipm should not be IPX_STATUS_time_limit","");
  if (iVar1 == 6) {
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_48[0]);
    fflush((FILE *)0x0);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  bVar3 = true;
  if (iVar1 != 6) {
    iVar2 = (ipx_info->super_ipx_info).status_ipm;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"solved  status_ipm should not be IPX_STATUS_iter_limit","");
    bVar3 = iVar2 == 7;
    if (bVar3) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_68[0]);
      fflush((FILE *)0x0);
    }
  }
  if ((iVar1 != 6) && (local_68[0] != local_58)) {
    operator_delete(local_68[0]);
  }
  bVar4 = true;
  if (!bVar3) {
    iVar1 = (ipx_info->super_ipx_info).status_ipm;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"solved  status_ipm should not be IPX_STATUS_no_progress","");
    bVar4 = iVar1 == 8;
    if (bVar4) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_88[0]);
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar3) && (local_88[0] != local_78)) {
    operator_delete(local_88[0]);
  }
  bVar3 = true;
  if (!bVar4) {
    iVar1 = (ipx_info->super_ipx_info).status_ipm;
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"solved  status_ipm should not be IPX_STATUS_failed","");
    bVar3 = iVar1 == 9;
    if (bVar3) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_a8[0]);
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar4) && (local_a8[0] != local_98)) {
    operator_delete(local_a8[0]);
  }
  bVar4 = true;
  if (!bVar3) {
    iVar1 = (ipx_info->super_ipx_info).status_ipm;
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,"solved  status_ipm should not be IPX_STATUS_debug","");
    bVar4 = iVar1 == 10;
    if (bVar4) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_c8[0]);
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar3) && (local_c8[0] != local_b8)) {
    operator_delete(local_c8[0]);
  }
  bVar3 = true;
  if (!bVar4) {
    iVar1 = (ipx_info->super_ipx_info).status_crossover;
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"solved  status_crossover should not be IPX_STATUS_primal_infeas",
               "");
    bVar3 = iVar1 == 3;
    if (bVar3) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_e8[0]);
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar4) && (local_e8[0] != local_d8)) {
    operator_delete(local_e8[0]);
  }
  bVar4 = true;
  if (!bVar3) {
    iVar1 = (ipx_info->super_ipx_info).status_crossover;
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"solved  status_crossover should not be IPX_STATUS_dual_infeas",
               "");
    bVar4 = iVar1 == 4;
    if (bVar4) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_108[0])
      ;
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar3) && (local_108[0] != local_f8)) {
    operator_delete(local_108[0]);
  }
  bVar3 = true;
  if (!bVar4) {
    iVar1 = (ipx_info->super_ipx_info).status_crossover;
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"solved  status_crossover should not be IPX_STATUS_time_limit",""
              );
    bVar3 = iVar1 == 6;
    if (bVar3) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_128[0])
      ;
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar4) && (local_128[0] != local_118)) {
    operator_delete(local_128[0]);
  }
  bVar4 = true;
  if (!bVar3) {
    iVar1 = (ipx_info->super_ipx_info).status_crossover;
    local_148[0] = local_138;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"solved  status_crossover should not be IPX_STATUS_iter_limit",""
              );
    bVar4 = iVar1 == 7;
    if (bVar4) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_148[0])
      ;
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar3) && (local_148[0] != local_138)) {
    operator_delete(local_148[0]);
  }
  bVar3 = true;
  if (!bVar4) {
    iVar1 = (ipx_info->super_ipx_info).status_crossover;
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"solved  status_crossover should not be IPX_STATUS_no_progress",
               "");
    bVar3 = iVar1 == 8;
    if (bVar3) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_168[0])
      ;
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar4) && (local_168[0] != local_158)) {
    operator_delete(local_168[0]);
  }
  bVar4 = true;
  if (!bVar3) {
    iVar1 = (ipx_info->super_ipx_info).status_crossover;
    local_188[0] = local_178;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_188,"solved  status_crossover should not be IPX_STATUS_failed","");
    bVar4 = iVar1 == 9;
    if (bVar4) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_188[0])
      ;
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar3) && (local_188[0] != local_178)) {
    operator_delete(local_188[0]);
  }
  bVar3 = true;
  if (!bVar4) {
    iVar1 = (ipx_info->super_ipx_info).status_crossover;
    local_1a8[0] = local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"solved  status_crossover should not be IPX_STATUS_debug","");
    bVar3 = iVar1 == 10;
    if (bVar3) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_1a8[0])
      ;
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar4) && (local_1a8[0] != local_198)) {
    operator_delete(local_1a8[0]);
  }
  return bVar3;
}

Assistant:

bool illegalIpxSolvedStatus(const ipx::Info& ipx_info,
                            const HighsOptions& options) {
  bool found_illegal_status = false;
  //========
  // For IPX
  //========
  // Can solve and be optimal
  // Can solve and be imprecise
  // Can solve and be primal_infeas
  // Can solve and be dual_infeas
  // Cannot solve and reach time limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_ipm == IPX_STATUS_time_limit, options,
                     "solved  status_ipm should not be IPX_STATUS_time_limit");
  // Cannot solve and reach iteration limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_ipm == IPX_STATUS_iter_limit, options,
                     "solved  status_ipm should not be IPX_STATUS_iter_limit");
  // Cannot solve and make no progress
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_ipm == IPX_STATUS_no_progress, options,
                     "solved  status_ipm should not be IPX_STATUS_no_progress");
  // Cannot solve and failed
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_ipm == IPX_STATUS_failed, options,
                     "solved  status_ipm should not be IPX_STATUS_failed");
  // Cannot solve and debug
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_ipm == IPX_STATUS_debug, options,
                     "solved  status_ipm should not be IPX_STATUS_debug");
  //==============
  // For crossover
  //==============
  // Can solve and be optimal
  // Can solve and be imprecise
  // Cannot solve with primal infeasibility
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_primal_infeas, options,
          "solved  status_crossover should not be IPX_STATUS_primal_infeas");
  // Cannot solve with dual infeasibility
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_dual_infeas, options,
          "solved  status_crossover should not be IPX_STATUS_dual_infeas");
  // Cannot solve and reach time limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_time_limit, options,
          "solved  status_crossover should not be IPX_STATUS_time_limit");
  // Cannot solve and reach time limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_iter_limit, options,
          "solved  status_crossover should not be IPX_STATUS_iter_limit");
  // Cannot solve and make no progress
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_no_progress, options,
          "solved  status_crossover should not be IPX_STATUS_no_progress");
  // Cannot solve and failed
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_failed, options,
          "solved  status_crossover should not be IPX_STATUS_failed");
  // Cannot solve and debug
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_crossover == IPX_STATUS_debug, options,
                     "solved  status_crossover should not be IPX_STATUS_debug");
  return found_illegal_status;
}